

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall
QByteArray::toPercentEncoding
          (QByteArray *__return_storage_ptr__,QByteArray *this,QByteArray *exclude,
          QByteArray *include,char percent)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *__length;
  char *pcVar5;
  char *__file;
  long lVar6;
  
  bVar3 = isNull(this);
  if (bVar3) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if ((this->d).size == 0) {
    pcVar5 = (this->d).ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = &_empty;
    }
    QByteArray(__return_storage_ptr__,pcVar5,0);
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&this->d);
    pcVar5 = (this->d).ptr;
    lVar2 = (this->d).size;
    __file = (char *)0x0;
    pcVar4 = (char *)0x0;
    __length = extraout_RDX;
    for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 1) {
      bVar1 = pcVar5[lVar6];
      if (bVar1 == percent) {
LAB_002d4553:
        if (pcVar4 == (char *)0x0) {
          resize(__return_storage_ptr__,(this->d).size * 3);
          pcVar4 = data(__return_storage_ptr__);
        }
        pcVar4[(long)__file] = percent;
        __length = "0123456789ABCDEF";
        (pcVar4 + 1)[(long)__file] = "0123456789ABCDEF"[bVar1 >> 4];
        (pcVar4 + 2)[(long)__file] = "0123456789ABCDEF"[bVar1 & 0xf];
        __file = __file + 3;
      }
      else {
        if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
            (1 < bVar1 - 0x2d)) && ((bVar1 != 0x5f && (bVar1 != 0x7e)))) {
          bVar3 = toPercentEncoding::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)exclude,
                             (QByteArray *)(ulong)(uint)(int)(char)bVar1,(char)__length);
          __length = extraout_RDX_00;
          if (!bVar3) goto LAB_002d4553;
        }
        bVar3 = toPercentEncoding::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)include,
                           (QByteArray *)(ulong)(uint)(int)(char)bVar1,(char)__length);
        if (bVar3) goto LAB_002d4553;
        if (pcVar4 != (char *)0x0) {
          pcVar4[(long)__file] = bVar1;
        }
        __file = __file + 1;
        __length = extraout_RDX_01;
      }
    }
    if (pcVar4 != (char *)0x0) {
      truncate(__return_storage_ptr__,__file,(__off_t)__length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::toPercentEncoding(const QByteArray &exclude, const QByteArray &include,
                                         char percent) const
{
    if (isNull())
        return QByteArray();    // preserve null
    if (isEmpty())
        return QByteArray(data(), 0);

    const auto contains = [](const QByteArray &view, char c) {
        // As view.contains(c), but optimised to bypass a lot of overhead:
        return view.size() > 0 && memchr(view.data(), c, view.size()) != nullptr;
    };

    QByteArray result = *this;
    char *output = nullptr;
    qsizetype length = 0;

    for (unsigned char c : *this) {
        if (char(c) != percent
            && ((c >= 0x61 && c <= 0x7A) // ALPHA
                || (c >= 0x41 && c <= 0x5A) // ALPHA
                || (c >= 0x30 && c <= 0x39) // DIGIT
                || c == 0x2D // -
                || c == 0x2E // .
                || c == 0x5F // _
                || c == 0x7E // ~
                || contains(exclude, c))
            && !contains(include, c)) {
            if (output)
                output[length] = c;
            ++length;
        } else {
            if (!output) {
                // detach now
                result.resize(size() * 3); // worst case
                output = result.data();
            }
            output[length++] = percent;
            output[length++] = QtMiscUtils::toHexUpper((c & 0xf0) >> 4);
            output[length++] = QtMiscUtils::toHexUpper(c & 0xf);
        }
    }
    if (output)
        result.truncate(length);

    return result;
}